

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O0

bool __thiscall AllDiffDomain<0>::prune(AllDiffDomain<0> *this,int node,int i)

{
  Reason r_00;
  bool bVar1;
  int *piVar2;
  Lit *pLVar3;
  long v_00;
  IntView<0> *this_00;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int v;
  int j_1;
  int k;
  int j;
  int scc;
  int max_val;
  int min_val;
  int vals;
  int vars;
  Clause *r;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined1 channel;
  Clause *in_stack_ffffffffffffff70;
  int sz;
  IntView<0> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  Reason local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  Clause *local_18;
  int local_10;
  int local_c;
  
  local_18 = (Clause *)0x0;
  local_10 = in_EDX;
  local_c = in_ESI;
  if (so.lazy) {
    local_1c = 0;
    local_20 = 0;
    local_24 = 0x7fffffff;
    local_28 = -0x80000000;
    local_30 = *(int *)(*(long *)(in_RDI + 0x40) + (long)in_EDX * 0x14 + 0xc);
    local_2c = local_30;
    for (; -1 < local_30; local_30 = *(int *)(*(long *)(in_RDI + 0x38) + (long)local_30 * 0x14)) {
      if (local_30 < *(int *)(in_RDI + 0x20)) {
        local_1c = local_1c + 1;
      }
      else {
        local_20 = local_20 + 1;
        local_34 = local_30 - *(int *)(in_RDI + 0x20);
        piVar2 = std::min<int>(&local_24,&local_34);
        local_24 = *piVar2;
        local_38 = local_30 - *(int *)(in_RDI + 0x20);
        piVar2 = std::max<int>(&local_28,&local_38);
        local_28 = *piVar2;
        *(undefined1 *)(*(long *)(in_RDI + 0x60) + (long)(local_30 - *(int *)(in_RDI + 0x20))) = 1;
      }
    }
    sz = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    if (local_20 == 1) {
      local_18 = ::Reason_new(sz);
      in_stack_ffffffffffffff84 = local_2c;
      if (*(int *)(in_RDI + 0x20) <= local_2c) {
        in_stack_ffffffffffffff84 = *(int *)(*(long *)(in_RDI + 0x38) + (long)local_2c * 0x14);
      }
      local_3c = (int)IntView<0>::getValLit
                                ((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      pLVar3 = Clause::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      pLVar3->x = local_3c;
    }
    else {
      local_18 = ::Reason_new(sz);
      local_40 = 1;
      for (local_44 = local_2c; -1 < local_44;
          local_44 = *(int *)(*(long *)(in_RDI + 0x38) + (long)local_44 * 0x14)) {
        if (local_44 < *(int *)(in_RDI + 0x20)) {
          local_4c = (int)IntView<0>::getLit(in_stack_ffffffffffffff78,
                                             (int64_t)in_stack_ffffffffffffff70,
                                             in_stack_ffffffffffffff6c);
          local_48 = (int)operator~((Lit)0x1aa52a);
          local_40 = local_40 + 1;
          pLVar3 = Clause::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          pLVar3->x = local_48;
          local_50 = local_24;
          while (local_50 = local_50 + 1, local_50 < local_28) {
            if ((*(byte *)(*(long *)(in_RDI + 0x60) + (long)local_50) & 1) == 0) {
              local_58 = (int)IntView<0>::getLit(in_stack_ffffffffffffff78,
                                                 (int64_t)in_stack_ffffffffffffff70,
                                                 in_stack_ffffffffffffff6c);
              local_54 = (int)operator~((Lit)0x1aa5a5);
              local_40 = local_40 + 1;
              pLVar3 = Clause::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
              pLVar3->x = local_54;
            }
          }
          local_60 = (int)IntView<0>::getLit(in_stack_ffffffffffffff78,
                                             (int64_t)in_stack_ffffffffffffff70,
                                             in_stack_ffffffffffffff6c);
          local_5c = (int)operator~((Lit)0x1aa609);
          local_40 = local_40 + 1;
          pLVar3 = Clause::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          pLVar3->x = local_5c;
        }
      }
    }
    memset((void *)(*(long *)(in_RDI + 0x60) + (long)local_24),0,(long)((local_28 + 1) - local_24));
  }
  channel = (undefined1)((uint)in_stack_ffffffffffffff6c >> 0x18);
  v_00 = *(long *)(in_RDI + 0x28) + (long)local_c * 0x10;
  this_00 = (IntView<0> *)(long)local_10;
  Reason::Reason(&local_68,local_18);
  r_00.field_0._a._4_4_ = in_stack_ffffffffffffff84;
  r_00.field_0._a._0_4_ = in_stack_ffffffffffffff80;
  bVar1 = IntView<0>::remVal(this_00,v_00,r_00,(bool)channel);
  return bVar1;
}

Assistant:

bool prune(int node, int i) {
		// fprintf(stderr, "prune var %d val %d\n", node, i);
		Clause* r = nullptr;
		if (so.lazy) {
			int vars = 0;
			int vals = 0;
			int min_val = INT_MAX;
			int max_val = INT_MIN;
			const int scc = val_nodes[i].scc;
			for (int j = scc; j >= 0; j = var_nodes[j].next) {
				if (j < sz) {
					++vars;
				} else {
					++vals;
					min_val = std::min(min_val, j - sz);
					max_val = std::max(max_val, j - sz);
					scoreboard[j - sz] = true;
				}
			}
			assert(vars == vals);
			if (vals == 1) {
				r = Reason_new(2);
				(*r)[1] = x[(scc < sz) ? scc : var_nodes[scc].next].getValLit();
			} else {
				r = Reason_new(1 + vars * (2 + (max_val + 1 - min_val) - vals));
				int k = 1;
				for (int j = scc; j >= 0; j = var_nodes[j].next) {
					if (j < sz) {
						(*r)[k++] = ~x[j].getLit(min_val, LR_GE);
						for (int v = min_val + 1; v < max_val; ++v) {
							if (!scoreboard[v]) {
								(*r)[k++] = ~x[j].getLit(v, LR_NE);
							}
						}
						(*r)[k++] = ~x[j].getLit(max_val, LR_LE);
					}
				}
				assert(k == 1 + vars * (2 + (max_val + 1 - min_val) - vals));
			}
			memset(scoreboard + min_val, 0, max_val + 1 - min_val);
		}
		return x[node].remVal(i, r);
	}